

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

void __thiscall trun::Process::OnStdErrData(Process *this,string *data)

{
  ProcessCallbackInterface *pPVar1;
  pointer pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pPVar1 = this->callback;
  if (pPVar1 != (ProcessCallbackInterface *)0x0) {
    pcVar2 = (data->_M_dataplus)._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar2,pcVar2 + data->_M_string_length);
    (*pPVar1->_vptr_ProcessCallbackInterface[3])(pPVar1,local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void Process::OnStdErrData(std::string data) {
	if (callback != NULL) {
		callback->OnStdErrData(data);
	}
}